

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O0

GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
* __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Resolve(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          *__return_storage_ptr__,
         GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
         *this,GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *baseuri,CrtAllocator *allocator)

{
  Ch *pCVar1;
  SizeType SVar2;
  SizeType SVar3;
  Ch *pCVar4;
  size_t local_50;
  size_t lastslashpos;
  size_t pos;
  CrtAllocator *allocator_local;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *baseuri_local;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_local;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *resuri;
  
  GenericUri(__return_storage_ptr__,(CrtAllocator *)0x0);
  __return_storage_ptr__->allocator_ = allocator;
  SVar2 = GetStringLength(this);
  SVar3 = GetStringLength(baseuri);
  Allocate(__return_storage_ptr__,(ulong)(SVar2 + 1 + SVar3));
  SVar2 = GetSchemeStringLength(this);
  if (SVar2 == 0) {
    pCVar4 = __return_storage_ptr__->scheme_;
    pCVar1 = baseuri->scheme_;
    SVar2 = GetSchemeStringLength(baseuri);
    pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
    __return_storage_ptr__->auth_ = pCVar4;
    SVar2 = GetAuthStringLength(this);
    if (SVar2 == 0) {
      pCVar4 = __return_storage_ptr__->auth_;
      pCVar1 = baseuri->auth_;
      SVar2 = GetAuthStringLength(baseuri);
      pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
      __return_storage_ptr__->path_ = pCVar4;
      SVar2 = GetPathStringLength(this);
      if (SVar2 == 0) {
        pCVar4 = __return_storage_ptr__->path_;
        pCVar1 = baseuri->path_;
        SVar2 = GetPathStringLength(baseuri);
        pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
        __return_storage_ptr__->query_ = pCVar4;
        SVar2 = GetQueryStringLength(this);
        if (SVar2 == 0) {
          pCVar4 = __return_storage_ptr__->query_;
          pCVar1 = baseuri->query_;
          SVar2 = GetQueryStringLength(baseuri);
          pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
          __return_storage_ptr__->frag_ = pCVar4;
        }
        else {
          pCVar4 = __return_storage_ptr__->query_;
          pCVar1 = this->query_;
          SVar2 = GetQueryStringLength(this);
          pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
          __return_storage_ptr__->frag_ = pCVar4;
        }
      }
      else {
        if (*this->path_ == '/') {
          pCVar4 = __return_storage_ptr__->path_;
          pCVar1 = this->path_;
          SVar2 = GetPathStringLength(this);
          pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
          __return_storage_ptr__->query_ = pCVar4;
          RemoveDotSegments(__return_storage_ptr__);
        }
        else {
          lastslashpos = 0;
          SVar2 = GetAuthStringLength(baseuri);
          if ((SVar2 != 0) && (SVar2 = GetPathStringLength(baseuri), SVar2 == 0)) {
            *__return_storage_ptr__->path_ = '/';
            lastslashpos = 1;
          }
          SVar2 = GetPathStringLength(baseuri);
          for (local_50 = (size_t)SVar2; (local_50 != 0 && (baseuri->path_[local_50 - 1] != '/'));
              local_50 = local_50 - 1) {
          }
          memcpy(__return_storage_ptr__->path_ + lastslashpos,baseuri->path_,local_50);
          pCVar4 = __return_storage_ptr__->path_;
          pCVar1 = this->path_;
          SVar2 = GetPathStringLength(this);
          pCVar4 = CopyPart(this,pCVar4 + lastslashpos + local_50,pCVar1,(ulong)SVar2);
          __return_storage_ptr__->query_ = pCVar4;
          RemoveDotSegments(__return_storage_ptr__);
        }
        pCVar4 = __return_storage_ptr__->query_;
        pCVar1 = this->query_;
        SVar2 = GetQueryStringLength(this);
        pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
        __return_storage_ptr__->frag_ = pCVar4;
      }
    }
    else {
      pCVar4 = __return_storage_ptr__->auth_;
      pCVar1 = this->auth_;
      SVar2 = GetAuthStringLength(this);
      pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
      __return_storage_ptr__->path_ = pCVar4;
      pCVar4 = __return_storage_ptr__->path_;
      pCVar1 = this->path_;
      SVar2 = GetPathStringLength(this);
      pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
      __return_storage_ptr__->query_ = pCVar4;
      pCVar4 = __return_storage_ptr__->query_;
      pCVar1 = this->query_;
      SVar2 = GetQueryStringLength(this);
      pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
      __return_storage_ptr__->frag_ = pCVar4;
      RemoveDotSegments(__return_storage_ptr__);
    }
  }
  else {
    pCVar4 = __return_storage_ptr__->scheme_;
    pCVar1 = this->scheme_;
    SVar2 = GetSchemeStringLength(this);
    pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
    __return_storage_ptr__->auth_ = pCVar4;
    pCVar4 = __return_storage_ptr__->auth_;
    pCVar1 = this->auth_;
    SVar2 = GetAuthStringLength(this);
    pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
    __return_storage_ptr__->path_ = pCVar4;
    pCVar4 = __return_storage_ptr__->path_;
    pCVar1 = this->path_;
    SVar2 = GetPathStringLength(this);
    pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
    __return_storage_ptr__->query_ = pCVar4;
    pCVar4 = __return_storage_ptr__->query_;
    pCVar1 = this->query_;
    SVar2 = GetQueryStringLength(this);
    pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
    __return_storage_ptr__->frag_ = pCVar4;
    RemoveDotSegments(__return_storage_ptr__);
  }
  pCVar4 = __return_storage_ptr__->frag_;
  pCVar1 = this->frag_;
  SVar2 = GetFragStringLength(this);
  pCVar4 = CopyPart(this,pCVar4,pCVar1,(ulong)SVar2);
  __return_storage_ptr__->base_ = pCVar4;
  SetBase(__return_storage_ptr__);
  pCVar4 = __return_storage_ptr__->base_;
  SVar2 = GetBaseStringLength(__return_storage_ptr__);
  __return_storage_ptr__->uri_ = pCVar4 + (ulong)SVar2 + 1;
  SetUri(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

GenericUri Resolve(const GenericUri& baseuri, Allocator* allocator = 0) {
        GenericUri resuri;
        resuri.allocator_ = allocator;
        // Ensure enough space for combining paths
        resuri.Allocate(GetStringLength() + baseuri.GetStringLength() + 1); // + 1 for joining slash

        if (!(GetSchemeStringLength() == 0)) {
            // Use all of this URI
            resuri.auth_ = CopyPart(resuri.scheme_, scheme_, GetSchemeStringLength());
            resuri.path_ = CopyPart(resuri.auth_, auth_, GetAuthStringLength());
            resuri.query_ = CopyPart(resuri.path_, path_, GetPathStringLength());
            resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
            resuri.RemoveDotSegments();
        } else {
            // Use the base scheme
            resuri.auth_ = CopyPart(resuri.scheme_, baseuri.scheme_, baseuri.GetSchemeStringLength());
            if (!(GetAuthStringLength() == 0)) {
                // Use this auth, path, query
                resuri.path_ = CopyPart(resuri.auth_, auth_, GetAuthStringLength());
                resuri.query_ = CopyPart(resuri.path_, path_, GetPathStringLength());
                resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
                resuri.RemoveDotSegments();
            } else {
                // Use the base auth
                resuri.path_ = CopyPart(resuri.auth_, baseuri.auth_, baseuri.GetAuthStringLength());
                if (GetPathStringLength() == 0) {
                    // Use the base path
                    resuri.query_ = CopyPart(resuri.path_, baseuri.path_, baseuri.GetPathStringLength());
                    if (GetQueryStringLength() == 0) {
                        // Use the base query
                        resuri.frag_ = CopyPart(resuri.query_, baseuri.query_, baseuri.GetQueryStringLength());
                    } else {
                        // Use this query
                        resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
                    }
                } else {
                    if (path_[0] == '/') {
                        // Absolute path - use all of this path
                        resuri.query_ = CopyPart(resuri.path_, path_, GetPathStringLength());
                        resuri.RemoveDotSegments();
                    } else {
                        // Relative path - append this path to base path after base path's last slash
                        size_t pos = 0;
                        if (!(baseuri.GetAuthStringLength() == 0) && baseuri.GetPathStringLength() == 0) {
                            resuri.path_[pos] = '/';
                            pos++;
                        }
                        size_t lastslashpos = baseuri.GetPathStringLength();
                        while (lastslashpos > 0) {
                            if (baseuri.path_[lastslashpos - 1] == '/') break;
                            lastslashpos--;
                        }
                        std::memcpy(&resuri.path_[pos], baseuri.path_, lastslashpos * sizeof(Ch));
                        pos += lastslashpos;
                        resuri.query_ = CopyPart(&resuri.path_[pos], path_, GetPathStringLength());
                        resuri.RemoveDotSegments();
                    }
                    // Use this query
                    resuri.frag_ = CopyPart(resuri.query_, query_, GetQueryStringLength());
                }
            }
        }
        // Always use this frag
        resuri.base_ = CopyPart(resuri.frag_, frag_, GetFragStringLength());

        // Re-constitute base_ and uri_
        resuri.SetBase();
        resuri.uri_ = resuri.base_ + resuri.GetBaseStringLength() + 1;
        resuri.SetUri();
        return resuri;
    }